

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_update_raw_mouse_mode(Terminal *term)

{
  byte local_12;
  _Bool want_raw;
  Terminal *term_local;
  
  local_12 = 0;
  if (term->xterm_mouse != L'\0') {
    local_12 = term->xterm_mouse_forbidden ^ 0xff;
  }
  win_set_raw_mouse_mode(term->win,(_Bool)(local_12 & 1));
  term->win_pointer_shape_pending = true;
  term->win_pointer_shape_raw = (_Bool)(local_12 & 1);
  term_schedule_update(term);
  return;
}

Assistant:

static void term_update_raw_mouse_mode(Terminal *term)
{
    bool want_raw = (term->xterm_mouse != 0 && !term->xterm_mouse_forbidden);
    win_set_raw_mouse_mode(term->win, want_raw);
    term->win_pointer_shape_pending = true;
    term->win_pointer_shape_raw = want_raw;
    term_schedule_update(term);
}